

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laserDriver.h
# Opt level: O0

bool checkRPLIDARHealth(RPlidarDriver *drv)

{
  byte local_1f [3];
  uint local_1c;
  rplidar_response_device_health_t healthinfo;
  RPlidarDriver *pRStack_18;
  u_result op_result;
  RPlidarDriver *drv_local;
  
  pRStack_18 = drv;
  local_1c = (**(code **)(*(long *)drv + 0x48))(drv,local_1f,2000);
  if ((local_1c & 0x80000000) == 0) {
    printf("RPLidar health status : %d\n",(ulong)local_1f[0]);
    if (local_1f[0] == 2) {
      fprintf(_stderr,"Error, rplidar internal error detected. Please reboot the device to retry.\n"
             );
      drv_local._7_1_ = false;
    }
    else {
      drv_local._7_1_ = true;
    }
  }
  else {
    fprintf(_stderr,"Error, cannot retrieve the lidar health code: %x\n",(ulong)local_1c);
    drv_local._7_1_ = false;
  }
  return drv_local._7_1_;
}

Assistant:

bool checkRPLIDARHealth(RPlidarDriver * drv)
{
    u_result     op_result;
    rplidar_response_device_health_t healthinfo;


    op_result = drv->getHealth(healthinfo);
    if (IS_OK(op_result)) { // the macro IS_OK is the preperred way to judge whether the operation is succeed.
        printf("RPLidar health status : %d\n", healthinfo.status);
        if (healthinfo.status == RPLIDAR_STATUS_ERROR) {
            fprintf(stderr, "Error, rplidar internal error detected. Please reboot the device to retry.\n");
            // enable the following code if you want rplidar to be reboot by software
            // drv->reset();
            return false;
        } else {
            return true;
        }

    } else {
        fprintf(stderr, "Error, cannot retrieve the lidar health code: %x\n", op_result);
        return false;
    }
}